

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddCScriptWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CScript *redeemScript)

{
  uint uVar1;
  WalletStorage *pWVar2;
  uint uVar3;
  CScript *data;
  bool bVar4;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  uint160 result;
  uint160 local_b8;
  CSHA256 local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = FillableSigningProvider::AddCScript
                    (&(this->super_LegacyDataSPKM).super_FillableSigningProvider,redeemScript);
  if (bVar4) {
    local_b8.super_base_blob<160U>.m_data._M_elems[0] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[1] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[2] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[3] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[4] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[5] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[6] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[7] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
    local_b8.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
    local_98.buf[0x30] = '\0';
    local_98.buf[0x31] = '\0';
    local_98.buf[0x32] = '\0';
    local_98.buf[0x33] = '\0';
    local_98.buf[0x34] = '\0';
    local_98.buf[0x35] = '\0';
    local_98.buf[0x36] = '\0';
    local_98.buf[0x37] = '\0';
    local_98.buf[0x38] = '\0';
    local_98.buf[0x39] = '\0';
    local_98.buf[0x3a] = '\0';
    local_98.buf[0x3b] = '\0';
    local_98.buf[0x3c] = '\0';
    local_98.buf[0x3d] = '\0';
    local_98.buf[0x3e] = '\0';
    local_98.buf[0x3f] = '\0';
    local_98.buf[0x20] = '\0';
    local_98.buf[0x21] = '\0';
    local_98.buf[0x22] = '\0';
    local_98.buf[0x23] = '\0';
    local_98.buf[0x24] = '\0';
    local_98.buf[0x25] = '\0';
    local_98.buf[0x26] = '\0';
    local_98.buf[0x27] = '\0';
    local_98.buf[0x28] = '\0';
    local_98.buf[0x29] = '\0';
    local_98.buf[0x2a] = '\0';
    local_98.buf[0x2b] = '\0';
    local_98.buf[0x2c] = '\0';
    local_98.buf[0x2d] = '\0';
    local_98.buf[0x2e] = '\0';
    local_98.buf[0x2f] = '\0';
    local_98.buf[0x10] = '\0';
    local_98.buf[0x11] = '\0';
    local_98.buf[0x12] = '\0';
    local_98.buf[0x13] = '\0';
    local_98.buf[0x14] = '\0';
    local_98.buf[0x15] = '\0';
    local_98.buf[0x16] = '\0';
    local_98.buf[0x17] = '\0';
    local_98.buf[0x18] = '\0';
    local_98.buf[0x19] = '\0';
    local_98.buf[0x1a] = '\0';
    local_98.buf[0x1b] = '\0';
    local_98.buf[0x1c] = '\0';
    local_98.buf[0x1d] = '\0';
    local_98.buf[0x1e] = '\0';
    local_98.buf[0x1f] = '\0';
    local_98.buf[0] = '\0';
    local_98.buf[1] = '\0';
    local_98.buf[2] = '\0';
    local_98.buf[3] = '\0';
    local_98.buf[4] = '\0';
    local_98.buf[5] = '\0';
    local_98.buf[6] = '\0';
    local_98.buf[7] = '\0';
    local_98.buf[8] = '\0';
    local_98.buf[9] = '\0';
    local_98.buf[10] = '\0';
    local_98.buf[0xb] = '\0';
    local_98.buf[0xc] = '\0';
    local_98.buf[0xd] = '\0';
    local_98.buf[0xe] = '\0';
    local_98.buf[0xf] = '\0';
    local_98.s[4] = 0;
    local_98.s[5] = 0;
    local_98.s[6] = 0;
    local_98.s[7] = 0;
    local_98.s[0] = 0;
    local_98.s[1] = 0;
    local_98.s[2] = 0;
    local_98.s[3] = 0;
    local_98.bytes = 0;
    CSHA256::CSHA256(&local_98);
    uVar1 = (redeemScript->super_CScriptBase)._size;
    uVar3 = uVar1 - 0x1d;
    data = (CScript *)(redeemScript->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
      data = redeemScript;
    }
    CSHA256::Write(&local_98,(uchar *)data,(ulong)uVar3);
    output.m_size = 0x14;
    output.m_data = (uchar *)&local_b8;
    CHash160::Finalize((CHash160 *)&local_98,output);
    bVar4 = WalletBatch::WriteCScript(batch,&local_b8,redeemScript);
    if (bVar4) {
      pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      (*pWVar2->_vptr_WalletStorage[5])(pWVar2,batch);
      bVar4 = true;
      goto LAB_004ea3af;
    }
  }
  bVar4 = false;
LAB_004ea3af:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool LegacyScriptPubKeyMan::AddCScriptWithDB(WalletBatch& batch, const CScript& redeemScript)
{
    if (!FillableSigningProvider::AddCScript(redeemScript))
        return false;
    if (batch.WriteCScript(Hash160(redeemScript), redeemScript)) {
        m_storage.UnsetBlankWalletFlag(batch);
        return true;
    }
    return false;
}